

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O1

int __thiscall QMessageBoxPrivate::execReturnCode(QMessageBoxPrivate *this,QAbstractButton *button)

{
  long lVar1;
  long lVar2;
  long lVar3;
  StandardButton SVar4;
  undefined4 extraout_var;
  long lVar5;
  int iVar6;
  long lVar7;
  
  SVar4 = QDialogButtonBox::standardButton((QDialogButtonBox *)this->buttonBox,button);
  lVar5 = CONCAT44(extraout_var,SVar4);
  if (SVar4 != NoButton) {
    if (this->compatMode != true) {
      return SVar4;
    }
    SVar4 = SVar4 & 0xfffffcff;
    if ((int)SVar4 < 0x20000) {
      if ((int)SVar4 < 0x8000) {
        if (SVar4 == FirstButton) {
          return 1;
        }
        if (SVar4 == Yes) {
          return 3;
        }
      }
      else {
        if (SVar4 == YesToAll) {
          return 8;
        }
        if (SVar4 == No) {
          return 4;
        }
      }
    }
    else if ((int)SVar4 < 0x80000) {
      if (SVar4 == NoToAll) {
        return 9;
      }
      if (SVar4 == Abort) {
        return 5;
      }
    }
    else {
      if (SVar4 == Retry) {
        return 6;
      }
      if (SVar4 == Ignore) {
        return 7;
      }
      if (SVar4 == Cancel) {
        return 2;
      }
    }
    return 0;
  }
  lVar2 = (this->customButtonList).d.size;
  if (lVar2 != 0) {
    lVar7 = -8;
    do {
      lVar1 = lVar2 * -8 + lVar7;
      if (lVar1 == -8) goto LAB_0050b7f2;
      lVar5 = lVar7 + 8;
      lVar3 = lVar7 + 8;
      lVar7 = lVar5;
    } while (*(QAbstractButton **)((long)(this->customButtonList).d.ptr + lVar3) != button);
    lVar5 = lVar5 >> 3;
LAB_0050b7f2:
    if (lVar1 != -8) goto LAB_0050b7ff;
  }
  lVar5 = -1;
LAB_0050b7ff:
  iVar6 = (int)lVar5 + 2;
  if (lVar5 < 0) {
    iVar6 = (int)lVar5;
  }
  return iVar6;
}

Assistant:

int QMessageBoxPrivate::execReturnCode(QAbstractButton *button)
{
    if (int standardButton = buttonBox->standardButton(button)) {
        // When using a QMessageBox with standard buttons, the return
        // code is a StandardButton value indicating the standard button
        // that was clicked.
        if (compatMode)
            return oldButton(standardButton);
        else
            return standardButton;
    } else {
        // When using QMessageBox with custom buttons, the return code
        // is an opaque value, and the user is expected to use clickedButton()
        // to determine which button was clicked. We make sure to keep the opaque
        // value out of the QDialog::DialogCode range, so we can distinguish them.
        auto customButtonIndex = customButtonList.indexOf(button);
        if (customButtonIndex >= 0)
            return QDialog::DialogCode::Accepted + customButtonIndex + 1;
        else
            return customButtonIndex; // Not found, return -1
    }
}